

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O0

TestCaseResultPtr __thiscall xe::BatchResult::createTestCaseResult(BatchResult *this,char *casePath)

{
  char *__s;
  size_type sVar1;
  mapped_type *pmVar2;
  TestCaseResultData *this_00;
  char *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  *this_01;
  TestCaseResultPtr TVar3;
  allocator<char> local_41;
  key_type local_40;
  char *local_20;
  char *casePath_local;
  BatchResult *this_local;
  TestCaseResultPtr *caseResult;
  
  this_01 = (vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
             *)(casePath + 0xe0);
  local_20 = in_RDX;
  casePath_local = casePath;
  this_local = this;
  sVar1 = std::
          vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
          ::size(this_01);
  std::
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  ::reserve(this_01,sVar1 + 1);
  sVar1 = std::
          vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
          ::size(this_01);
  __s = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)(casePath + 0xf8),&local_40);
  *pmVar2 = (mapped_type)sVar1;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = (TestCaseResultData *)operator_new(0x60);
  TestCaseResultData::TestCaseResultData(this_00,local_20);
  de::SharedPtr<xe::TestCaseResultData>::SharedPtr
            ((SharedPtr<xe::TestCaseResultData> *)this,this_00);
  std::
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  ::push_back((vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
               *)(casePath + 0xe0),(value_type *)this);
  TVar3.m_state = extraout_RDX;
  TVar3.m_ptr = (TestCaseResultData *)this;
  return TVar3;
}

Assistant:

TestCaseResultPtr BatchResult::createTestCaseResult (const char* casePath)
{
	DE_ASSERT(!hasTestCaseResult(casePath));

	m_testCaseResults.reserve(m_testCaseResults.size()+1);
	m_resultMap[casePath] = (int)m_testCaseResults.size();

	TestCaseResultPtr caseResult(new TestCaseResultData(casePath));
	m_testCaseResults.push_back(caseResult);

	return caseResult;
}